

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DateImplementation.cpp
# Opt level: O0

double Js::DateImplementation::DateFncUTC(ScriptContext *scriptContext,Arguments *args)

{
  bool bVar1;
  Var aValue;
  double dVar2;
  double local_98;
  uint local_7c;
  uint ivar;
  double dblT;
  double tv;
  double rgdbl [7];
  int kcvarMax;
  Arguments *args_local;
  ScriptContext *scriptContext_local;
  
  if ((SUB84(args->Info,0) & 0xffffff) == 1 || ((ulong)args->Info & 0xffffff) == 0) {
    scriptContext_local = (ScriptContext *)NumberConstants::NaN;
  }
  else {
    for (local_7c = 0; local_7c < (SUB84(args->Info,0) & 0xffffff) - 1 && local_7c < 7;
        local_7c = local_7c + 1) {
      aValue = Arguments::operator[](args,local_7c + 1);
      dVar2 = JavascriptConversion::ToNumber(aValue,scriptContext);
      rgdbl[(ulong)local_7c - 1] = dVar2;
    }
    for (local_7c = 0; local_7c < 7; local_7c = local_7c + 1) {
      if (local_7c < (SUB84(args->Info,0) & 0xffffff) - 1) {
        dVar2 = rgdbl[(ulong)local_7c - 1];
        bVar1 = NumberUtilities::IsFinite(dVar2);
        if (!bVar1) {
          return NumberConstants::NaN;
        }
        dVar2 = ConvertToInteger(dVar2);
        rgdbl[(ulong)local_7c - 1] = dVar2;
      }
      else {
        local_98 = 1.0;
        if (local_7c != 2) {
          local_98 = 0.0;
        }
        rgdbl[(ulong)local_7c - 1] = local_98;
      }
    }
    if ((tv < 100.0) && (0.0 <= tv)) {
      tv = tv + 1900.0;
    }
    scriptContext_local =
         (ScriptContext *)
         DateUtilities::TvFromDate
                   (tv,rgdbl[0],rgdbl[1] - 1.0,
                    rgdbl[4] * 1000.0 + rgdbl[2] * 3600000.0 + rgdbl[3] * 60000.0 + rgdbl[5]);
    if (((double)scriptContext_local < -8.64e+15) || (8.64e+15 < (double)scriptContext_local)) {
      scriptContext_local = (ScriptContext *)NumberConstants::NaN;
    }
  }
  return (double)scriptContext_local;
}

Assistant:

double DateImplementation::DateFncUTC(ScriptContext* scriptContext, Arguments args)
    {
        const int kcvarMax = 7;
        double rgdbl[kcvarMax];
        double tv;
        double dblT;
        uint ivar;

        // See: https://github.com/Microsoft/ChakraCore/issues/1665
        // Date.UTC should return NaN with 0 arguments.
        // args.Info.Count includes an implicit first parameter, so we check for Count <= 1.
        if (args.Info.Count <= 1)
        {
            return JavascriptNumber::NaN;
        }

        for (ivar = 0; (ivar < (args.Info.Count-1)) && ivar < kcvarMax; ++ivar)
        {
            rgdbl[ivar] = JavascriptConversion::ToNumber(args[ivar+1],scriptContext);

        }
        for (ivar = 0; ivar < kcvarMax; ivar++)
        {
            // Unspecified parameters are treated like zero, except date, which
            // is treated as 1.
            if (ivar >= (args.Info.Count - 1))
            {
                rgdbl[ivar] = (ivar == 2);
                continue;
            }
#pragma prefast(suppress:6001, "rgdbl index ivar < args.Info.Count - 1 are initialized")
            dblT = rgdbl[ivar];
            if (!Js::NumberUtilities::IsFinite(dblT))
            {
                return JavascriptNumber::NaN;
            }
            rgdbl[ivar] = ConvertToInteger(dblT);
        }

        // adjust the year
        if (rgdbl[0] < 100 && rgdbl[0] >= 0)
        {
            rgdbl[0] += 1900;
        }

        // Get the UTC time value.
        tv = TvFromDate(rgdbl[0], rgdbl[1], rgdbl[2] - 1,
            rgdbl[3] * 3600000 + rgdbl[4] * 60000 + rgdbl[5] * 1000 + rgdbl[6]);

        if (tv < ktvMin || tv > ktvMax)
        {
            return JavascriptNumber::NaN;
        }
        else
        {
            return tv;
        }
    }